

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_conjunctive.cpp
# Opt level: O0

uint32_t sel_lt_int32_col_int32_val_branching
                   (uint32_t n,uint32_t *res_sel,int32_t *col,int32_t val,uint32_t *sel)

{
  uint local_3c;
  uint local_38;
  uint32_t i_1;
  uint32_t i;
  uint32_t res;
  uint32_t *sel_local;
  int32_t val_local;
  int32_t *col_local;
  uint32_t *res_sel_local;
  uint32_t n_local;
  
  i_1 = 0;
  if (sel == (uint32_t *)0x0) {
    for (local_3c = 0; local_3c < n; local_3c = local_3c + 1) {
      if (col[local_3c] < val) {
        res_sel[i_1] = local_3c;
        i_1 = i_1 + 1;
      }
    }
  }
  else {
    for (local_38 = 0; local_38 < n; local_38 = local_38 + 1) {
      if (col[sel[local_38]] < val) {
        res_sel[i_1] = sel[local_38];
        i_1 = i_1 + 1;
      }
    }
  }
  return i_1;
}

Assistant:

static uint32_t sel_lt_int32_col_int32_val_branching(uint32_t n,
                                                     uint32_t *res_sel,
                                                     int32_t *col,
                                                     int32_t val,
                                                     uint32_t *sel) {
    uint32_t res = 0;

    if (sel != nullptr) {
        for (uint32_t i = 0; i < n; i++) {
            if (col[sel[i]] < val)
                res_sel[res++] = sel[i];
        }
    }
    else {
        for (uint32_t i = 0; i < n; i++) {
            if (col[i] < val)
                res_sel[res++] = i;
        }
    }

    return res;
}